

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathNewNodeSetList(xmlNodeSetPtr val)

{
  int iVar1;
  int local_1c;
  xmlXPathObjectPtr pxStack_18;
  int i;
  xmlXPathObjectPtr ret;
  xmlNodeSetPtr val_local;
  
  if (val == (xmlNodeSetPtr)0x0) {
    pxStack_18 = (xmlXPathObjectPtr)0x0;
  }
  else if (val->nodeTab == (xmlNodePtr *)0x0) {
    pxStack_18 = xmlXPathNewNodeSet((xmlNodePtr)0x0);
  }
  else {
    pxStack_18 = xmlXPathNewNodeSet(*val->nodeTab);
    if (pxStack_18 != (xmlXPathObjectPtr)0x0) {
      local_1c = 1;
      while ((local_1c < val->nodeNr &&
             (iVar1 = xmlXPathNodeSetAddUnique(pxStack_18->nodesetval,val->nodeTab[local_1c]),
             -1 < iVar1))) {
        local_1c = local_1c + 1;
      }
    }
  }
  return pxStack_18;
}

Assistant:

xmlXPathObjectPtr
xmlXPathNewNodeSetList(xmlNodeSetPtr val)
{
    xmlXPathObjectPtr ret;
    int i;

    if (val == NULL)
        ret = NULL;
    else if (val->nodeTab == NULL)
        ret = xmlXPathNewNodeSet(NULL);
    else {
        ret = xmlXPathNewNodeSet(val->nodeTab[0]);
        if (ret) {
            for (i = 1; i < val->nodeNr; ++i) {
                /* TODO: Propagate memory error. */
                if (xmlXPathNodeSetAddUnique(ret->nodesetval, val->nodeTab[i])
		    < 0) break;
	    }
	}
    }

    return (ret);
}